

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  ushort uVar1;
  ulong uVar2;
  byte bVar3;
  long lVar4;
  stbi_uc *psVar5;
  int iVar6;
  ulong uVar7;
  stbi__uint16 *psVar8;
  long lVar9;
  uint uVar10;
  
  iVar6 = 0;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    for (lVar9 = 0; (int)lVar9 < count[lVar4]; lVar9 = lVar9 + 1) {
      h->size[lVar9 + iVar6] = (char)lVar4 + '\x01';
    }
    iVar6 = iVar6 + (int)lVar9;
  }
  h->size[iVar6] = '\0';
  uVar10 = 0;
  uVar2 = 1;
  iVar6 = 0;
  do {
    if (uVar2 == 0x11) {
      h->maxcode[0x11] = 0xffffffff;
      memset(h,0xff,0x200);
      uVar7 = 0;
      uVar2 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar2 = uVar7;
      }
      for (; uVar7 != uVar2; uVar7 = uVar7 + 1) {
        if (h->size[uVar7] < 10) {
          uVar1 = h->code[uVar7];
          bVar3 = 9 - h->size[uVar7];
          for (lVar4 = 0; (uint)lVar4 >> (bVar3 & 0x1f) == 0; lVar4 = lVar4 + 1) {
            h->fast[lVar4 + ((ulong)uVar1 << (bVar3 & 0x3f))] = (stbi_uc)uVar7;
          }
        }
      }
      return 1;
    }
    h->delta[uVar2] = uVar10 - iVar6;
    uVar7 = (ulong)h->size[(int)uVar10];
    if (uVar2 == uVar7) {
      psVar8 = h->code + (int)uVar10;
      psVar5 = h->size + (long)(int)uVar10 + 1;
      while (uVar2 == uVar7) {
        *psVar8 = (stbi__uint16)iVar6;
        iVar6 = iVar6 + 1;
        bVar3 = *psVar5;
        uVar10 = uVar10 + 1;
        psVar8 = psVar8 + 1;
        psVar5 = psVar5 + 1;
        uVar7 = (ulong)bVar3;
      }
      if (iVar6 - 1U >> ((byte)uVar2 & 0x1f) != 0) {
        stbi__g_failure_reason = "bad code lengths";
        return 0;
      }
    }
    h->maxcode[uVar2] = iVar6 << (0x10 - (byte)uVar2 & 0x1f);
    iVar6 = iVar6 * 2;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i)
      for (j=0; j < count[i]; ++j)
         h->size[k++] = (stbi_uc) (i+1);
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}